

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

bool __thiscall
libtorrent::anon_unknown_0::ut_metadata_peer_plugin::on_extension_handshake
          (ut_metadata_peer_plugin *this,bdecode_node *h)

{
  undefined8 uVar1;
  bool bVar2;
  type_t tVar3;
  int64_t iVar4;
  string_view local_a8;
  int local_98;
  int metadata_size;
  string_view local_88;
  int local_78;
  undefined4 local_74;
  int index;
  undefined1 local_60 [8];
  bdecode_node messages;
  bdecode_node *h_local;
  ut_metadata_peer_plugin *this_local;
  
  this->m_message_index = 0;
  messages._56_8_ = h;
  tVar3 = bdecode_node::type(h);
  uVar1 = messages._56_8_;
  if (tVar3 == dict_t) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&index,"m");
    bdecode_node::dict_find_dict((bdecode_node *)local_60,(bdecode_node *)uVar1,_index);
    bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_60);
    if (bVar2) {
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_88,"ut_metadata");
      iVar4 = bdecode_node::dict_find_int_value((bdecode_node *)local_60,local_88,-1);
      uVar1 = messages._56_8_;
      local_78 = (int)iVar4;
      if (local_78 == -1) {
        this_local._7_1_ = false;
      }
      else {
        this->m_message_index = local_78;
        boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,"metadata_size");
        iVar4 = bdecode_node::dict_find_int_value((bdecode_node *)uVar1,local_a8,0);
        local_98 = (int)iVar4;
        if (local_98 < 1) {
          peer_connection::set_has_metadata(&this->m_pc->super_peer_connection,false);
        }
        else {
          ut_metadata_plugin::metadata_size(this->m_tp,local_98);
        }
        maybe_send_request(this);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    local_74 = 1;
    bdecode_node::~bdecode_node((bdecode_node *)local_60);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool on_extension_handshake(bdecode_node const& h) override
		{
			m_message_index = 0;
			if (h.type() != bdecode_node::dict_t) return false;
			bdecode_node const messages = h.dict_find_dict("m");
			if (!messages) return false;

			int index = int(messages.dict_find_int_value("ut_metadata", -1));
			if (index == -1) return false;
			m_message_index = index;

			int metadata_size = int(h.dict_find_int_value("metadata_size"));
			if (metadata_size > 0)
				m_tp.metadata_size(metadata_size);
			else
				m_pc.set_has_metadata(false);

			maybe_send_request();
			return true;
		}